

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

_Bool tableSet(Table *table,ObjString *key,Value value)

{
  Entry *oldArray;
  ObjString *pOVar1;
  int iVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  Value *pVVar5;
  long lVar6;
  int capacity;
  int iVar7;
  bool bVar8;
  
  capacity = table->capacity;
  iVar2 = capacity + 1;
  if ((double)(table->count + 1) <= (double)iVar2 * 0.75) {
    pEVar3 = table->entries;
  }
  else {
    bVar8 = 6 < capacity;
    capacity = 7;
    if (bVar8) {
      capacity = iVar2 * 2 + -1;
    }
    pEVar3 = (Entry *)reallocate((void *)0x0,0,(ulong)(capacity + 1U) << 4);
    lVar6 = (long)(int)(capacity + 1U);
    pVVar5 = &pEVar3->value;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      ((Entry *)(pVVar5 + -1))->key = (ObjString *)0x0;
      *pVVar5 = 0x7ffc000000000001;
      pVVar5 = pVVar5 + 2;
    }
    table->count = 0;
    iVar2 = table->capacity;
    oldArray = table->entries;
    iVar7 = -1;
    if (-1 < iVar2) {
      iVar7 = iVar2;
    }
    lVar6 = (long)iVar7 + 1;
    pVVar5 = &oldArray->value;
    iVar7 = 0;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      pOVar1 = ((Entry *)(pVVar5 + -1))->key;
      if (pOVar1 != (ObjString *)0x0) {
        pEVar4 = findEntry(pEVar3,capacity,pOVar1);
        pEVar4->key = pOVar1;
        pEVar4->value = *pVVar5;
        iVar7 = iVar7 + 1;
        table->count = iVar7;
      }
      pVVar5 = pVVar5 + 2;
    }
    reallocate(oldArray,(long)iVar2 * 0x10 + 0x10,0);
    table->entries = pEVar3;
    table->capacity = capacity;
  }
  pEVar3 = findEntry(pEVar3,capacity,key);
  pOVar1 = pEVar3->key;
  if ((pOVar1 == (ObjString *)0x0) && (pEVar3->value == 0x7ffc000000000001)) {
    table->count = table->count + 1;
  }
  pEVar3->key = key;
  pEVar3->value = value;
  return pOVar1 == (ObjString *)0x0;
}

Assistant:

bool tableSet(Table *table, ObjString *key, Value value) {
    //grow when the array becomes at least 75% full.
    if (table->count + 1 > (table->capacity + 1) * TABLE_MAX_LOAD) {
        int capacity = GROW_CAPACITY(table->capacity + 1) - 1;
        adjustCapacity(table, capacity);
    }

    Entry *entry = findEntry(table->entries, table->capacity, key);
    bool isNewKey = entry->key == NULL;

    //The count is no longer the number of entries in the hash table,
    // it’s the number of entries plus tombstones
    if (isNewKey && IS_NIL(entry->value)) table->count++;

    entry->key = key;
    entry->value = value;
    return isNewKey;
}